

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_index.cc
# Opt level: O2

void __thiscall
S2CellIndex::GetIntersectingLabels
          (S2CellIndex *this,S2CellUnion *target,vector<int,_std::allocator<int>_> *labels)

{
  pointer piVar1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  piVar1 = (labels->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((labels->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (labels->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = piVar1;
  }
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<bool_(S2CellId,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_index.cc:143:34)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<bool_(S2CellId,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_index.cc:143:34)>
             ::_M_manager;
  local_28._M_unused._M_object = labels;
  VisitIntersectingCells(this,target,(CellVisitor *)&local_28);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  std::
  __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((labels->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start,
             (labels->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_finish);
  __first = std::
            __unique<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                      ((labels->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start,
                       (labels->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish);
  std::vector<int,_std::allocator<int>_>::erase
            (labels,(const_iterator)__first._M_current,
             (const_iterator)
             (labels->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_finish);
  return;
}

Assistant:

void S2CellIndex::GetIntersectingLabels(const S2CellUnion& target,
                                        std::vector<Label>* labels) const {
  labels->clear();
  VisitIntersectingCells(target, [labels](S2CellId cell_id, Label label) {
      labels->push_back(label);
      return true;
    });
  std::sort(labels->begin(), labels->end());
  labels->erase(std::unique(labels->begin(), labels->end()), labels->end());
}